

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinVerticesProcess.cpp
# Opt level: O0

int __thiscall
Assimp::JoinVerticesProcess::ProcessMesh(JoinVerticesProcess *this,aiMesh *pMesh,uint meshIndex)

{
  pointer *ppuVar1;
  aiAnimMesh *pMesh_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  LogSeverity LVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  Logger *pLVar10;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar11;
  basic_formatter *this_00;
  aiFace *paVar12;
  aiVertexWeight aVar13;
  reference __src;
  ulong uVar14;
  aiVertexWeight local_7f0;
  float local_794;
  char *local_760;
  bool local_6fd;
  aiVertexWeight local_6b8;
  aiVertexWeight nw;
  aiVertexWeight *ow;
  undefined1 local_6a0 [4];
  uint b_3;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> newWeights;
  aiBone *bone;
  int a_3;
  uint b_2;
  aiFace *face_1;
  uint local_668;
  uint a_2;
  uint animMeshIndex_3;
  char *local_658;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  string local_4d8;
  undefined1 local_4b4 [8];
  Vertex aniMeshVertex_1;
  uint animMeshIndex_2;
  Vertex aniMeshVertex;
  Vertex *animatedUV;
  uint animMeshIndex_1;
  bool breaksAnimMesh;
  Vertex *uv;
  uint uidx;
  uint vidx;
  uint b_1;
  uint matchIndex;
  Vertex v;
  _Node_iterator_base<unsigned_int,_false> local_150;
  key_type local_148;
  uint local_144;
  uint a_1;
  uint animMeshIndex;
  vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
  uniqueAnimatedVertices;
  undefined1 local_120 [6];
  bool hasAnimMeshes;
  bool complex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  SpatPair *blubb;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *avf;
  SpatialSort _vertexFinder;
  SpatialSort *vertexFinder;
  undefined1 local_c0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> replaceIndex;
  vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> uniqueVertices;
  uint local_7c;
  uint b;
  aiFace *face;
  uint a;
  undefined1 local_60 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  usedVertexIndices;
  uint meshIndex_local;
  aiMesh *pMesh_local;
  JoinVerticesProcess *this_local;
  
  usedVertexIndices._M_h._M_single_bucket._4_4_ = meshIndex;
  bVar2 = aiMesh::HasPositions(pMesh);
  if ((bVar2) && (bVar2 = aiMesh::HasFaces(pMesh), bVar2)) {
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_60);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::reserve((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)local_60,(ulong)pMesh->mNumVertices);
    for (face._0_4_ = 0; (uint)face < pMesh->mNumFaces; face._0_4_ = (uint)face + 1) {
      paVar12 = pMesh->mFaces;
      for (local_7c = 0; local_7c < paVar12[(uint)face].mNumIndices; local_7c = local_7c + 1) {
        std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_60,paVar12[(uint)face].mIndices + local_7c);
      }
    }
    ppuVar1 = &replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::vector
              ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)ppuVar1);
    std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::reserve
              ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)ppuVar1,
               (ulong)pMesh->mNumVertices);
    uVar4 = pMesh->mNumVertices;
    vertexFinder._4_4_ = 0xffffffff;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&vertexFinder + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,(ulong)uVar4,
               (value_type_conflict1 *)((long)&vertexFinder + 4),
               (allocator<unsigned_int> *)((long)&vertexFinder + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&vertexFinder + 3));
    _vertexFinder.mPositions.
    super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SpatialSort::SpatialSort((SpatialSort *)&avf);
    if (((this->super_BaseProcess).shared != (SharedPostProcessInfo *)0x0) &&
       (SharedPostProcessInfo::
        GetProperty<std::vector<std::pair<Assimp::SpatialSort,float>,std::allocator<std::pair<Assimp::SpatialSort,float>>>>
                  ((this->super_BaseProcess).shared,"$Spat",
                   (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                    **)&blubb), blubb != (SpatPair *)0x0)) {
      verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                    ::operator[]((vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                                  *)blubb,(ulong)usedVertexIndices._M_h._M_single_bucket._4_4_);
      _vertexFinder.mPositions.
      super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    if (_vertexFinder.mPositions.
        super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      SpatialSort::Fill((SpatialSort *)&avf,pMesh->mVertices,pMesh->mNumVertices,0xc,true);
      _vertexFinder.mPositions.
      super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&avf;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120,10);
    uVar4 = aiMesh::GetNumColorChannels(pMesh);
    local_6fd = true;
    if (uVar4 == 0) {
      uVar4 = aiMesh::GetNumUVChannels(pMesh);
      local_6fd = 1 < uVar4;
    }
    uniqueAnimatedVertices.
    super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_6fd;
    uniqueAnimatedVertices.
    super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = pMesh->mNumAnimMeshes != 0;
    std::
    vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
    ::vector((vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
              *)&a_1);
    if ((uniqueAnimatedVertices.
         super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      std::
      vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
      ::resize((vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                *)&a_1,(ulong)pMesh->mNumAnimMeshes);
      for (local_144 = 0; local_144 < pMesh->mNumAnimMeshes; local_144 = local_144 + 1) {
        pvVar6 = std::
                 vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                 ::operator[]((vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                               *)&a_1,(ulong)local_144);
        std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::reserve
                  (pvVar6,(ulong)pMesh->mNumVertices);
      }
    }
    for (local_148 = 0; local_148 < pMesh->mNumVertices; local_148 = local_148 + 1) {
      local_150._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::find((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_60,&local_148);
      v.colors[7]._8_8_ =
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_60);
      bVar2 = std::__detail::operator==
                        (&local_150,(_Node_iterator_base<unsigned_int,_false> *)&v.colors[7].b);
      if (!bVar2) {
        Vertex::Vertex((Vertex *)&b_1,pMesh,local_148);
        SpatialSort::FindIdenticalPositions
                  ((SpatialSort *)
                   _vertexFinder.mPositions.
                   super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(aiVector3D *)&b_1,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120);
        vidx = 0xffffffff;
        for (uidx = 0;
            sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120),
            uVar4 = vidx, uidx < sVar7; uidx = uidx + 1) {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120,
                              (ulong)uidx);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,
                              (ulong)*pvVar8);
          uVar4 = *pvVar8;
          if ((uVar4 & 0x80000000) == 0) {
            pvVar9 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                               ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
                                &replaceIndex.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar4);
            bVar2 = anon_unknown.dwarf_9c3bd::areVerticesEqual
                              ((Vertex *)&b_1,pvVar9,
                               (bool)(uniqueAnimatedVertices.
                                      super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1))
            ;
            if (bVar2) {
              if ((uniqueAnimatedVertices.
                   super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) break;
              bVar2 = false;
              for (animatedUV._0_4_ = 0; (uint)animatedUV < pMesh->mNumAnimMeshes;
                  animatedUV._0_4_ = (uint)animatedUV + 1) {
                pvVar6 = std::
                         vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                         ::operator[]((vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                                       *)&a_1,(ulong)(uint)animatedUV);
                pvVar9 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::operator[]
                                   (pvVar6,(ulong)uVar4);
                Vertex::Vertex((Vertex *)&aniMeshVertex_1.colors[7].a,
                               pMesh->mAnimMeshes[(uint)animatedUV],local_148);
                bVar3 = anon_unknown.dwarf_9c3bd::areVerticesEqual
                                  ((Vertex *)&aniMeshVertex_1.colors[7].a,pvVar9,
                                   (bool)(uniqueAnimatedVertices.
                                          super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ &
                                         1));
                if (!bVar3) {
                  bVar2 = true;
                  break;
                }
              }
              if (!bVar2) break;
            }
          }
        }
        vidx = uVar4;
        if (vidx == 0xffffffff) {
          ppuVar1 = &replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          sVar7 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::size
                            ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)ppuVar1);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,
                              (ulong)local_148);
          *pvVar8 = (value_type)sVar7;
          std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::push_back
                    ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)ppuVar1,
                     (value_type *)&b_1);
          if ((uniqueAnimatedVertices.
               super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
            for (aniMeshVertex_1.colors[7].b = 0.0;
                (uint)aniMeshVertex_1.colors[7].b < pMesh->mNumAnimMeshes;
                aniMeshVertex_1.colors[7].b = (float)((int)aniMeshVertex_1.colors[7].b + 1)) {
              Vertex::Vertex((Vertex *)local_4b4,
                             pMesh->mAnimMeshes[(uint)aniMeshVertex_1.colors[7].b],local_148);
              pvVar6 = std::
                       vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                       ::operator[]((vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                                     *)&a_1,(ulong)(uint)aniMeshVertex_1.colors[7].b);
              std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::push_back
                        (pvVar6,(value_type *)local_4b4);
            }
          }
        }
        else {
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,
                              (ulong)local_148);
          *pvVar8 = vidx | 0x80000000;
        }
      }
    }
    bVar2 = DefaultLogger::isNullLogger();
    if (!bVar2) {
      pLVar10 = DefaultLogger::get();
      LVar5 = Logger::getLogSeverity(pLVar10);
      if (LVar5 == VERBOSE) {
        pLVar10 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[6]>(&local_650,(char (*) [6])0xb74a8f);
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_650,(uint *)((long)&usedVertexIndices._M_h._M_single_bucket + 4))
        ;
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(char (*) [3])0xb5c0ff);
        if ((pMesh->mName).length == 0) {
          local_760 = "unnamed";
        }
        else {
          local_760 = (pMesh->mName).data;
        }
        local_658 = local_760;
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,&local_658);
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(char (*) [15])") | Verts in: ");
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,&pMesh->mNumVertices);
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(char (*) [7])" out: ");
        _animMeshIndex_3 =
             std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::size
                       ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
                        &replaceIndex.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(unsigned_long *)&animMeshIndex_3);
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(char (*) [5])" | ~");
        uVar4 = pMesh->mNumVertices;
        sVar7 = std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::size
                          ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
                           &replaceIndex.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        local_794 = (float)(uVar4 - sVar7);
        a_2 = (uint)((local_794 / (float)pMesh->mNumVertices) * 100.0);
        pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(float *)&a_2);
        this_00 = (basic_formatter *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_(pbVar11,(char (*) [2])0xb6277f);
        Formatter::basic_formatter::operator_cast_to_string(&local_4d8,this_00);
        Logger::debug(pLVar10,&local_4d8);
        std::__cxx11::string::~string((string *)&local_4d8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter(&local_650);
      }
    }
    anon_unknown.dwarf_9c3bd::updateXMeshVertices<aiMesh>
              (pMesh,(vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
                     &replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((uniqueAnimatedVertices.
         super__Vector_base<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      for (local_668 = 0; local_668 < pMesh->mNumAnimMeshes; local_668 = local_668 + 1) {
        pMesh_00 = pMesh->mAnimMeshes[local_668];
        pvVar6 = std::
                 vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                 ::operator[]((vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
                               *)&a_1,(ulong)local_668);
        anon_unknown.dwarf_9c3bd::updateXMeshVertices<aiAnimMesh>(pMesh_00,pvVar6);
      }
    }
    for (face_1._4_4_ = 0; face_1._4_4_ < pMesh->mNumFaces; face_1._4_4_ = face_1._4_4_ + 1) {
      paVar12 = pMesh->mFaces + face_1._4_4_;
      for (bone._4_4_ = 0; bone._4_4_ < paVar12->mNumIndices; bone._4_4_ = bone._4_4_ + 1) {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,
                            (ulong)paVar12->mIndices[bone._4_4_]);
        paVar12->mIndices[bone._4_4_] = *pvVar8 & 0x7fffffff;
      }
    }
    for (bone._0_4_ = 0; (int)bone < (int)pMesh->mNumBones; bone._0_4_ = (int)bone + 1) {
      newWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pMesh->mBones[(int)bone];
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::vector
                ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_6a0);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_6a0,
                 (ulong)(uint)newWeights.
                              super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage[0x80].mWeight);
      if (newWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[0x81] == (aiVertexWeight)0x0) {
        pLVar10 = DefaultLogger::get();
        Logger::error(pLVar10,"X-Export: aiBone shall contain weights, but pointer to them is NULL."
                     );
      }
      else {
        for (ow._4_4_ = 0.0;
            (uint)ow._4_4_ <
            (uint)newWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage[0x80].mWeight;
            ow._4_4_ = (float)((int)ow._4_4_ + 1)) {
          nw = (aiVertexWeight)
               ((long)newWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[0x81] +
               (ulong)(uint)ow._4_4_ * 8);
          pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,
                              (ulong)*(uint *)nw);
          if ((*pvVar8 & 0x80000000) == 0) {
            aiVertexWeight::aiVertexWeight(&local_6b8);
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,
                                (ulong)*(uint *)nw);
            local_6b8.mVertexId = *pvVar8;
            local_6b8.mWeight = *(float *)((long)nw + 4);
            std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                      ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_6a0,
                       &local_6b8);
          }
        }
      }
      sVar7 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                        ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_6a0);
      if (sVar7 != 0) {
        if (newWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[0x81] != (aiVertexWeight)0x0) {
          operator_delete__((void *)newWeights.
                                    super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage[0x81]);
        }
        sVar7 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size
                          ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_6a0);
        newWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0x80].mWeight = (float)sVar7;
        uVar14 = (ulong)(uint)newWeights.
                              super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage[0x80].mWeight;
        aVar13 = (aiVertexWeight)operator_new__(uVar14 << 3);
        if (uVar14 != 0) {
          local_7f0 = aVar13;
          do {
            aiVertexWeight::aiVertexWeight((aiVertexWeight *)local_7f0);
            local_7f0 = (aiVertexWeight)((long)local_7f0 + 8);
          } while (local_7f0 != (aiVertexWeight)((long)aVar13 + uVar14 * 8));
        }
        newWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0x81] = aVar13;
        aVar13 = newWeights.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage[0x81];
        __src = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::operator[]
                          ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_6a0,0);
        memcpy((void *)aVar13,__src,
               (ulong)(uint)newWeights.
                            super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage[0x80].mWeight << 3);
      }
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::~vector
                ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)local_6a0);
    }
    this_local._4_4_ = pMesh->mNumVertices;
    std::
    vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
    ::~vector((vector<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>,_std::allocator<std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>_>_>
               *)&a_1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120);
    SpatialSort::~SpatialSort((SpatialSort *)&avf);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
    std::vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_>::~vector
              ((vector<Assimp::Vertex,_std::allocator<Assimp::Vertex>_> *)
               &replaceIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_60);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int JoinVerticesProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshIndex)
{
    static_assert( AI_MAX_NUMBER_OF_COLOR_SETS    == 8, "AI_MAX_NUMBER_OF_COLOR_SETS    == 8");
	static_assert( AI_MAX_NUMBER_OF_TEXTURECOORDS == 8, "AI_MAX_NUMBER_OF_TEXTURECOORDS == 8");

    // Return early if we don't have any positions
    if (!pMesh->HasPositions() || !pMesh->HasFaces()) {
        return 0;
    }

    // We should care only about used vertices, not all of them
    // (this can happen due to original file vertices buffer being used by
    // multiple meshes)
    std::unordered_set<unsigned int> usedVertexIndices;
    usedVertexIndices.reserve(pMesh->mNumVertices);
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for( unsigned int b = 0; b < face.mNumIndices; b++) {
            usedVertexIndices.insert(face.mIndices[b]);
        }
    }

    // We'll never have more vertices afterwards.
    std::vector<Vertex> uniqueVertices;
    uniqueVertices.reserve( pMesh->mNumVertices);

    // For each vertex the index of the vertex it was replaced by.
    // Since the maximal number of vertices is 2^31-1, the most significand bit can be used to mark
    //  whether a new vertex was created for the index (true) or if it was replaced by an existing
    //  unique vertex (false). This saves an additional std::vector<bool> and greatly enhances
    //  branching performance.
    static_assert(AI_MAX_VERTICES == 0x7fffffff, "AI_MAX_VERTICES == 0x7fffffff");
    std::vector<unsigned int> replaceIndex( pMesh->mNumVertices, 0xffffffff);

    // float posEpsilonSqr;
    SpatialSort* vertexFinder = NULL;
    SpatialSort _vertexFinder;

    typedef std::pair<SpatialSort,float> SpatPair;
    if (shared) {
        std::vector<SpatPair >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)    {
            SpatPair& blubb = (*avf)[meshIndex];
            vertexFinder  = &blubb.first;
            // posEpsilonSqr = blubb.second;
        }
    }
    if (!vertexFinder)  {
        // bad, need to compute it.
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        // posEpsilonSqr = ComputePositionEpsilon(pMesh);
    }

    // Again, better waste some bytes than a realloc ...
    std::vector<unsigned int> verticesFound;
    verticesFound.reserve(10);

    // Run an optimized code path if we don't have multiple UVs or vertex colors.
    // This should yield false in more than 99% of all imports ...
    const bool complex = ( pMesh->GetNumColorChannels() > 0 || pMesh->GetNumUVChannels() > 1);
    const bool hasAnimMeshes = pMesh->mNumAnimMeshes > 0;

    // We'll never have more vertices afterwards.
    std::vector<std::vector<Vertex>> uniqueAnimatedVertices;
    if (hasAnimMeshes) {
        uniqueAnimatedVertices.resize(pMesh->mNumAnimMeshes);
        for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
            uniqueAnimatedVertices[animMeshIndex].reserve(pMesh->mNumVertices);
        }
    }

    // Now check each vertex if it brings something new to the table
    for( unsigned int a = 0; a < pMesh->mNumVertices; a++)  {
        if (usedVertexIndices.find(a) == usedVertexIndices.end()) {
            continue;
        }

        // collect the vertex data
        Vertex v(pMesh,a);

        // collect all vertices that are close enough to the given position
        vertexFinder->FindIdenticalPositions( v.position, verticesFound);
        unsigned int matchIndex = 0xffffffff;

        // check all unique vertices close to the position if this vertex is already present among them
        for( unsigned int b = 0; b < verticesFound.size(); b++) {
            const unsigned int vidx = verticesFound[b];
            const unsigned int uidx = replaceIndex[ vidx];
            if( uidx & 0x80000000)
                continue;

            const Vertex& uv = uniqueVertices[ uidx];

            if (!areVerticesEqual(v, uv, complex)) {
                continue;
            }

            if (hasAnimMeshes) {
                // If given vertex is animated, then it has to be preserver 1 to 1 (base mesh and animated mesh require same topology)
                // NOTE: not doing this totaly breaks anim meshes as they don't have their own faces (they use pMesh->mFaces)
                bool breaksAnimMesh = false;
                for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
                    const Vertex& animatedUV = uniqueAnimatedVertices[animMeshIndex][ uidx];
                    Vertex aniMeshVertex(pMesh->mAnimMeshes[animMeshIndex], a);
                    if (!areVerticesEqual(aniMeshVertex, animatedUV, complex)) {
                        breaksAnimMesh = true;
                        break;
                    }
                }
                if (breaksAnimMesh) {
                    continue;
                }
            }

            // we're still here -> this vertex perfectly matches our given vertex
            matchIndex = uidx;
            break;
        }

        // found a replacement vertex among the uniques?
        if( matchIndex != 0xffffffff)
        {
            // store where to found the matching unique vertex
            replaceIndex[a] = matchIndex | 0x80000000;
        }
        else
        {
            // no unique vertex matches it up to now -> so add it
            replaceIndex[a] = (unsigned int)uniqueVertices.size();
            uniqueVertices.push_back( v);
            if (hasAnimMeshes) {
                for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
                    Vertex aniMeshVertex(pMesh->mAnimMeshes[animMeshIndex], a);
                    uniqueAnimatedVertices[animMeshIndex].push_back(aniMeshVertex);
                }
            }
        }
    }

    if (!DefaultLogger::isNullLogger() && DefaultLogger::get()->getLogSeverity() == Logger::VERBOSE)    {
        ASSIMP_LOG_DEBUG_F(
            "Mesh ",meshIndex,
            " (",
            (pMesh->mName.length ? pMesh->mName.data : "unnamed"),
            ") | Verts in: ",pMesh->mNumVertices,
            " out: ",
            uniqueVertices.size(),
            " | ~",
            ((pMesh->mNumVertices - uniqueVertices.size()) / (float)pMesh->mNumVertices) * 100.f,
            "%"
        );
    }

    updateXMeshVertices(pMesh, uniqueVertices);
    if (hasAnimMeshes) {
        for (unsigned int animMeshIndex = 0; animMeshIndex < pMesh->mNumAnimMeshes; animMeshIndex++) {
            updateXMeshVertices(pMesh->mAnimMeshes[animMeshIndex], uniqueAnimatedVertices[animMeshIndex]);
        }
    }

    // adjust the indices in all faces
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for( unsigned int b = 0; b < face.mNumIndices; b++) {
            face.mIndices[b] = replaceIndex[face.mIndices[b]] & ~0x80000000;
        }
    }

    // adjust bone vertex weights.
    for( int a = 0; a < (int)pMesh->mNumBones; a++) {
        aiBone* bone = pMesh->mBones[a];
        std::vector<aiVertexWeight> newWeights;
        newWeights.reserve( bone->mNumWeights);

        if ( NULL != bone->mWeights ) {
            for ( unsigned int b = 0; b < bone->mNumWeights; b++ ) {
                const aiVertexWeight& ow = bone->mWeights[ b ];
                // if the vertex is a unique one, translate it
                if ( !( replaceIndex[ ow.mVertexId ] & 0x80000000 ) ) {
                    aiVertexWeight nw;
                    nw.mVertexId = replaceIndex[ ow.mVertexId ];
                    nw.mWeight = ow.mWeight;
                    newWeights.push_back( nw );
                }
            }
        } else {
            ASSIMP_LOG_ERROR( "X-Export: aiBone shall contain weights, but pointer to them is NULL." );
        }

        if (newWeights.size() > 0) {
            // kill the old and replace them with the translated weights
            delete [] bone->mWeights;
            bone->mNumWeights = (unsigned int)newWeights.size();

            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            memcpy( bone->mWeights, &newWeights[0], bone->mNumWeights * sizeof( aiVertexWeight));
        }
    }
    return pMesh->mNumVertices;
}